

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O0

void ImGui_ImplGlfw_RestoreCallbacks(GLFWwindow *window)

{
  ImGui_ImplGlfw_Data *cbfun;
  GLFWwindow *in_RDI;
  ImGui_ImplGlfw_Data *bd;
  GLFWmonitorfun in_stack_ffffffffffffffe8;
  
  cbfun = ImGui_ImplGlfw_GetBackendData();
  glfwSetWindowFocusCallback(in_RDI,(GLFWwindowfocusfun)cbfun);
  glfwSetCursorEnterCallback(in_RDI,(GLFWcursorenterfun)cbfun);
  glfwSetCursorPosCallback(in_RDI,(GLFWcursorposfun)cbfun);
  glfwSetMouseButtonCallback(in_RDI,(GLFWmousebuttonfun)cbfun);
  glfwSetScrollCallback(in_RDI,(GLFWscrollfun)cbfun);
  glfwSetKeyCallback(in_RDI,(GLFWkeyfun)cbfun);
  glfwSetCharCallback(in_RDI,(GLFWcharfun)cbfun);
  glfwSetMonitorCallback(in_stack_ffffffffffffffe8);
  cbfun->InstalledCallbacks = false;
  cbfun->PrevUserCallbackWindowFocus = (GLFWwindowfocusfun)0x0;
  cbfun->PrevUserCallbackCursorEnter = (GLFWcursorenterfun)0x0;
  cbfun->PrevUserCallbackCursorPos = (GLFWcursorposfun)0x0;
  cbfun->PrevUserCallbackMousebutton = (GLFWmousebuttonfun)0x0;
  cbfun->PrevUserCallbackScroll = (GLFWscrollfun)0x0;
  cbfun->PrevUserCallbackKey = (GLFWkeyfun)0x0;
  cbfun->PrevUserCallbackChar = (GLFWcharfun)0x0;
  cbfun->PrevUserCallbackMonitor = (GLFWmonitorfun)0x0;
  return;
}

Assistant:

void ImGui_ImplGlfw_RestoreCallbacks(GLFWwindow* window)
{
    ImGui_ImplGlfw_Data* bd = ImGui_ImplGlfw_GetBackendData();
    IM_ASSERT(bd->InstalledCallbacks == true && "Callbacks not installed!");
    IM_ASSERT(bd->Window == window);

    glfwSetWindowFocusCallback(window, bd->PrevUserCallbackWindowFocus);
    glfwSetCursorEnterCallback(window, bd->PrevUserCallbackCursorEnter);
    glfwSetCursorPosCallback(window, bd->PrevUserCallbackCursorPos);
    glfwSetMouseButtonCallback(window, bd->PrevUserCallbackMousebutton);
    glfwSetScrollCallback(window, bd->PrevUserCallbackScroll);
    glfwSetKeyCallback(window, bd->PrevUserCallbackKey);
    glfwSetCharCallback(window, bd->PrevUserCallbackChar);
    glfwSetMonitorCallback(bd->PrevUserCallbackMonitor);
    bd->InstalledCallbacks = false;
    bd->PrevUserCallbackWindowFocus = nullptr;
    bd->PrevUserCallbackCursorEnter = nullptr;
    bd->PrevUserCallbackCursorPos = nullptr;
    bd->PrevUserCallbackMousebutton = nullptr;
    bd->PrevUserCallbackScroll = nullptr;
    bd->PrevUserCallbackKey = nullptr;
    bd->PrevUserCallbackChar = nullptr;
    bd->PrevUserCallbackMonitor = nullptr;
}